

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O2

void baoliSearch(int curlv,int remainF,int remainA,int gridSz)

{
  pointer ppiVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  iterator iter;
  float fVar12;
  float fVar13;
  int tAssignN [4];
  int local_48 [6];
  
  if (curlv == gridSz || remainA == 0 && remainF == 0) {
    lVar6 = std::chrono::_V2::system_clock::now();
    restime.__r = (lVar6 - (long)logtime.__d.__r) / 1000;
    if (0x37e11d9e7 < lVar6 - (long)logtime.__d.__r) {
      poVar7 = std::operator<<((ostream *)&std::cout,"ERROR:TLE");
      std::endl<char,std::char_traits<char>>(poVar7);
      exit(0);
    }
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    getAssignN(local_48,gridSz);
    lVar6 = (long)local_48[0];
    lVar8 = (long)local_48[1];
    lVar9 = (long)local_48[2];
    lVar11 = (long)local_48[3];
    ppiVar1 = *(pointer *)
               ((long)&dpRes[lVar6][lVar8][lVar9][lVar11].belongings.
                       super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data + 8);
    lVar10 = 0;
    for (iter._M_current =
              dpRes[lVar6][lVar8][lVar9][lVar11].belongings.
              super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
              _M_start; iter._M_current != ppiVar1; iter._M_current = iter._M_current + 1) {
      getCurAssign(iter);
      fVar2 = op_coef;
      fVar13 = *(float *)(*(long *)&dpRes[lVar6][lVar8][lVar9][lVar11].as.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data + lVar10);
      fVar12 = calOPAtk(gridSz);
      fVar13 = fVar12 * fVar2 + fVar13;
      if (resAtk < fVar13) {
        iVar4 = calAS(gridSz);
        iVar5 = calASofBomber(gridSz);
        if (tarAirSupremacy <= iVar5 + iVar4) {
          resBomberNum = curBomberNum - remainA;
          resAtk = fVar13;
          resAS = iVar5 + iVar4;
          copySign2Res(resSign,gridSz);
          copyCurAssign2Res(resAssign,resAssignGrid);
          if (flushFlag == true) {
            std::vector<Plane,_std::allocator<Plane>_>::operator=(&ResPlaneVecA,&planeVecA);
            flushFlag = false;
          }
        }
      }
      lVar10 = lVar10 + 4;
    }
  }
  else {
    if (remainF != 0) {
      sign[curlv] = 1;
      baoliSearch(curlv + 1,remainF + -1,remainA,gridSz);
      sign[curlv] = 0;
    }
    if (remainA != 0) {
      sign[curlv] = 2;
      bVar3 = cutF(curlv + 1,remainF,gridSz);
      if (bVar3) {
        if (gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
            _M_start[curlv].isFighterOnly == 0) {
          remainA = remainA + -1;
        }
        else {
          sign[curlv] = 0;
        }
        baoliSearch(curlv + 1,remainF,remainA,gridSz);
      }
      sign[curlv] = 0;
    }
  }
  return;
}

Assistant:

void baoliSearch(int curlv,int remainF,int remainA,int gridSz){
    if(curlv == gridSz || (remainF == 0 && remainA == 0)){//�ݹ�����
        if(restime=std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::system_clock::now()-logtime),restime.count()>TLE*1000000){
            cout<<"ERROR:TLE"<<endl;
            exit(0);
        }
        int tAssignN[4] = {0, 0, 0, 0};
        getAssignN(tAssignN, gridSz);//sav avail grids num to ships
        BelongStructure &curres=dpRes[tAssignN[0]][tAssignN[1]][tAssignN[2]][tAssignN[3]];
        vector<int *> &tlist=curres.belongings;
        int i=0;
        for(vector<int *>::iterator iter=tlist.begin(),end=tlist.end();iter!=end;++iter){
            getCurAssign(iter);
            float newAtk = curres.as[i++] + op_coef * calOPAtk(gridSz);
            if(newAtk > resAtk){
                int newAS = calAS(gridSz) + calASofBomber(gridSz);
                if(newAS >= tarAirSupremacy){
                    //write cur data to res
                    resAtk = newAtk;
                    resAS = newAS;
                    resBomberNum = curBomberNum - remainA;
                    copySign2Res(resSign, gridSz);
                    copyCurAssign2Res(resAssign,resAssignGrid);

                    if(flushFlag){
                        ResPlaneVecA = planeVecA;
                        flushFlag = 0;
                    }
                }
            }
        }
        return;
    }
    if(remainF){//���Է���ս���������ⷣվ
        sign[curlv]=1;
        baoliSearch(curlv+1,remainF-1,remainA,gridSz);
        sign[curlv]=0;
    }
    if(remainA){//���Է��ù�����
        sign[curlv]=2;
        if(cutF(curlv+1,remainF,gridSz)){
            if(gridVec[curlv].isFighterOnly){
                sign[curlv]=0;
                baoliSearch(curlv+1,remainF,remainA,gridSz);
            }
            else{
                baoliSearch(curlv+1,remainF,remainA-1,gridSz);
            }
        }
        sign[curlv]=0;
    }
}